

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

WindowQuantileState<double> * __thiscall
duckdb::QuantileState<double,_duckdb::QuantileStandardType>::GetOrCreateWindowState
          (QuantileState<double,_duckdb::QuantileStandardType> *this)

{
  bool bVar1;
  type pWVar2;
  unique_ptr<duckdb::WindowQuantileState<double>,_std::default_delete<duckdb::WindowQuantileState<double>_>,_true>
  *in_RDI;
  unique_ptr<duckdb::WindowQuantileState<double>,_std::default_delete<duckdb::WindowQuantileState<double>_>,_true>
  *in_stack_fffffffffffffff0;
  
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::WindowQuantileState<double>,_std::default_delete<duckdb::WindowQuantileState<double>_>_>
                      *)0x1d2f64b);
  if (!bVar1) {
    make_uniq<duckdb::WindowQuantileState<double>>();
    unique_ptr<duckdb::WindowQuantileState<double>,_std::default_delete<duckdb::WindowQuantileState<double>_>,_true>
    ::operator=(in_stack_fffffffffffffff0,in_RDI);
    unique_ptr<duckdb::WindowQuantileState<double>,_std::default_delete<duckdb::WindowQuantileState<double>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::WindowQuantileState<double>,_std::default_delete<duckdb::WindowQuantileState<double>_>,_true>
                   *)0x1d2f675);
  }
  pWVar2 = unique_ptr<duckdb::WindowQuantileState<double>,_std::default_delete<duckdb::WindowQuantileState<double>_>,_true>
           ::operator*(in_stack_fffffffffffffff0);
  return pWVar2;
}

Assistant:

WindowQuantileState<INPUT_TYPE> &GetOrCreateWindowState() {
		if (!window_state) {
			window_state = make_uniq<WindowQuantileState<INPUT_TYPE>>();
		}
		return *window_state;
	}